

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker> __thiscall
helics::BrokerFactory::getBrokerByIndex(BrokerFactory *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brks;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  local_30;
  
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::getObjects
            (&local_30,(SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers
            );
  if (index < (ulong)((long)local_30.
                            super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_30.
                            super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)
               (local_30.
                super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                ._M_impl.super__Vector_impl_data._M_start + index));
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
           *)&local_30);
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> getBrokerByIndex(size_t index)
{
    auto brks = searchableBrokers.getObjects();
    return brks.size() > index ? brks[index] : nullptr;
}